

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  undefined1 extraout_var [12];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 extraout_var_00 [12];
  undefined1 extraout_var_01 [12];
  undefined1 auVar18 [16];
  Mat local_b8;
  void *local_68;
  long local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar11 = 0;
  iVar5 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar5;
  iVar5 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar5;
  iVar5 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar5;
  iVar5 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar5;
  fVar14 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar14;
  iVar5 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar5;
  iVar5 = this->base_size;
  uVar1 = (this->ratios).w;
  uVar2 = (this->scales).w;
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  Mat::create(&local_b8,4,uVar2 * uVar1,4,(Allocator *)0x0);
  auVar16._0_4_ = (float)iVar5;
  auVar16._4_12_ = extraout_var;
  local_58 = auVar16._0_4_ * 0.5;
  local_68 = (this->ratios).data;
  uVar13 = 0;
  if (0 < (int)uVar2) {
    uVar13 = (ulong)uVar2;
  }
  uVar12 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar12 = uVar11;
  }
  auVar17 = auVar16;
  local_60 = (long)(int)uVar2;
  fStack_54 = local_58;
  fStack_50 = local_58;
  fStack_4c = local_58;
  for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
    fVar14 = *(float *)((long)local_68 + uVar10 * 4);
    auVar17 = rsqrtss(auVar17,ZEXT416((uint)fVar14));
    fVar15 = auVar17._0_4_;
    fVar15 = roundf(fVar15 * -0.5 * auVar16._0_4_ * (fVar14 * fVar15 * fVar15 + -3.0));
    pvVar3 = (this->scales).data;
    local_48 = (float)(int)fVar15;
    fStack_44 = (float)(int)extraout_var_00._0_4_;
    fStack_40 = (float)(int)extraout_var_00._4_4_;
    fStack_3c = (float)(int)extraout_var_00._8_4_;
    fVar14 = roundf(fVar14 * local_48);
    auVar18._0_4_ = (float)(int)fVar14;
    auVar18._4_4_ = (float)(int)extraout_var_01._0_4_;
    auVar18._8_4_ = (float)(int)extraout_var_01._4_4_;
    auVar18._12_4_ = (float)(int)extraout_var_01._8_4_;
    lVar6 = (long)local_b8.w * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    pfVar8 = (float *)(lVar6 * uVar11 + (long)local_b8.data);
    auVar17 = auVar18;
    for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
      fVar14 = *(float *)((long)pvVar3 + uVar9 * 4) * 0.5;
      auVar17._0_4_ = fVar14 * local_48;
      auVar17._4_4_ = fVar14 * auVar18._0_4_;
      auVar17._8_4_ = fVar14 * fStack_44;
      auVar17._12_4_ = fVar14 * auVar18._4_4_;
      *pfVar8 = local_58 - auVar17._0_4_;
      pfVar8[1] = fStack_54 - auVar17._4_4_;
      pfVar8[2] = auVar17._0_4_ + fStack_50;
      pfVar8[3] = auVar17._4_4_ + fStack_4c;
      pfVar8 = (float *)((long)pfVar8 + lVar6);
    }
    uVar11 = uVar11 + local_60;
  }
  piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (&this->anchors != &local_b8) {
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    piVar7 = (this->anchors).refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        pAVar4 = (this->anchors).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          free((this->anchors).data);
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->anchors).data = local_b8.data;
    piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    (this->anchors).refcount = piVar7;
    (this->anchors).elemsize = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    (this->anchors).elempack = local_b8.elempack;
    (this->anchors).allocator = local_b8.allocator;
    (this->anchors).dims = local_b8.dims;
    (this->anchors).w = local_b8.w;
    (this->anchors).h = local_b8.h;
    (this->anchors).d = local_b8.d;
    (this->anchors).c = local_b8.c;
    (this->anchors).cstep = local_b8.cstep;
  }
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        free(local_b8.data);
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

    //     Mat ratio;
    //     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}